

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

FunctionCallVar * __thiscall
kratos::Generator::call
          (Generator *this,string *func_name,
          vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_> *args
          )

{
  char cVar1;
  iterator iVar2;
  __shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  UserException *pUVar4;
  uint64_t i;
  ulong __val;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  long lVar5;
  basic_string_view<char> bVar6;
  string_view format_str;
  format_args args_00;
  string local_d8;
  undefined1 auStack_b8 [8];
  shared_ptr<kratos::FunctionCallVar> p;
  undefined1 local_80 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  mock_args;
  mapped_type func_def;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
          ::find(&(this->funcs_)._M_t,func_name);
  func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if ((_Rb_tree_header *)iVar2._M_node == &(this->funcs_)._M_t._M_impl.super__Rb_tree_header) {
    pUVar4 = (UserException *)__cxa_allocate_exception(0x10);
    auStack_b8 = (undefined1  [8])(func_name->_M_dataplus)._M_p;
    p.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)func_name->_M_string_length;
    bVar6 = fmt::v7::to_string_view<char,_0>("function {0} not found");
    format_str.data_ = (char *)bVar6.size_;
    format_str.size_ = 0xd;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_b8;
    fmt::v7::detail::vformat_abi_cxx11_((string *)local_80,(detail *)bVar6.data_,format_str,args_00)
    ;
    UserException::UserException(pUVar4,(string *)local_80);
    __cxa_throw(pUVar4,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  p_Var3 = &std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
            ::at(&this->funcs_,func_name)->
            super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2> *)
             &mock_args._M_t._M_impl.super__Rb_tree_header._M_node_count,p_Var3);
  cVar1 = (**(code **)(*(long *)mock_args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x80))
                    ();
  if (cVar1 != '\0') {
    mock_args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&mock_args;
    mock_args._M_t._M_impl._0_4_ = 0;
    mock_args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    mock_args._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    mock_args._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    lVar5 = 0;
    mock_args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         mock_args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    for (__val = 0;
        __val < (ulong)((long)(args->
                              super__Vector_base<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 4); __val = __val + 1) {
      std::__cxx11::to_string(&local_d8,__val);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>
      ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>
                  *)auStack_b8,&local_d8,
                 (shared_ptr<kratos::Var> *)
                 ((long)&(((args->
                           super__Vector_base<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar5
                 ));
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::shared_ptr<kratos::Var>>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                  *)local_80,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>
                  *)auStack_b8);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>
               *)auStack_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      lVar5 = lVar5 + 0x10;
    }
    local_d8._M_dataplus._M_p =
         (pointer)func_def.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    (**(code **)(*(long *)mock_args._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x70))();
    std::
    make_shared<kratos::FunctionCallVar,kratos::Generator*,std::shared_ptr<kratos::FunctionStmtBlock>&,std::map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>&,bool>
              ((Generator **)auStack_b8,(shared_ptr<kratos::FunctionStmtBlock> *)&local_d8,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                *)&mock_args._M_t._M_impl.super__Rb_tree_header._M_node_count,(bool *)local_80);
    std::
    _Rb_tree<std::shared_ptr<kratos::FunctionCallVar>,std::shared_ptr<kratos::FunctionCallVar>,std::_Identity<std::shared_ptr<kratos::FunctionCallVar>>,std::less<std::shared_ptr<kratos::FunctionCallVar>>,std::allocator<std::shared_ptr<kratos::FunctionCallVar>>>
    ::_M_emplace_unique<std::shared_ptr<kratos::FunctionCallVar>&>
              ((_Rb_tree<std::shared_ptr<kratos::FunctionCallVar>,std::shared_ptr<kratos::FunctionCallVar>,std::_Identity<std::shared_ptr<kratos::FunctionCallVar>>,std::less<std::shared_ptr<kratos::FunctionCallVar>>,std::allocator<std::shared_ptr<kratos::FunctionCallVar>>>
                *)&func_def.
                   super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi[0x41]._M_use_count,
               (shared_ptr<kratos::FunctionCallVar> *)auStack_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                 *)local_80);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&func_def);
    return (FunctionCallVar *)auStack_b8;
  }
  pUVar4 = (UserException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,"Only built-in function can be called without arg names",
             (allocator<char> *)auStack_b8);
  UserException::UserException(pUVar4,(string *)local_80);
  __cxa_throw(pUVar4,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FunctionCallVar &Generator::call(const std::string &func_name,
                                 const std::vector<std::shared_ptr<Var>> &args) {
    if (funcs_.find(func_name) == funcs_.end())
        throw UserException(::format("function {0} not found", func_name));
    auto func_def = funcs_.at(func_name);
    if (!func_def->is_builtin())
        throw UserException("Only built-in function can be called without arg names");
    std::map<std::string, std::shared_ptr<Var>> mock_args;
    for (uint64_t i = 0; i < args.size(); i++) {
        mock_args.emplace(std::make_pair(std::to_string(i), args[i]));
    }
    auto p =
        std::make_shared<FunctionCallVar>(this, func_def, mock_args, func_def->has_return_value());
    calls_.emplace(p);
    return *p;
}